

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_ObjCollectCopyFanins(Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  int iVar1;
  Wlc_Obj_t *p_00;
  int *piVar2;
  int nInts;
  int *pInts;
  Wlc_Obj_t *pObj;
  int iFanin;
  int i;
  Vec_Int_t *vFanins_local;
  int iObj_local;
  Wlc_Ntk_t *p_local;
  
  p_00 = Wlc_NtkObj(p,iObj);
  Vec_IntClear(vFanins);
  for (pObj._4_4_ = 0; iVar1 = Wlc_ObjFaninNum(p_00), pObj._4_4_ < iVar1;
      pObj._4_4_ = pObj._4_4_ + 1) {
    iVar1 = Wlc_ObjFaninId(p_00,pObj._4_4_);
    iVar1 = Wlc_ObjCopy(p,iVar1);
    Vec_IntPush(vFanins,iVar1);
  }
  if ((undefined1  [24])((undefined1  [24])*p_00 & (undefined1  [24])0x3f) == (undefined1  [24])0x6)
  {
    piVar2 = Wlc_ObjConstValue(p_00);
    iVar1 = Wlc_ObjRange(p_00);
    iVar1 = Abc_BitWordNum(iVar1);
    for (pObj._4_4_ = 0; pObj._4_4_ < iVar1; pObj._4_4_ = pObj._4_4_ + 1) {
      Vec_IntPush(vFanins,piVar2[pObj._4_4_]);
    }
  }
  else if (((undefined1  [24])((undefined1  [24])*p_00 & (undefined1  [24])0x3f) ==
            (undefined1  [24])0x13) ||
          ((undefined1  [24])((undefined1  [24])*p_00 & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x2c)) {
    iVar1 = Vec_IntSize(vFanins);
    if (iVar1 != 1) {
      __assert_fail("Vec_IntSize(vFanins) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcNtk.c"
                    ,0x20d,"void Wlc_ObjCollectCopyFanins(Wlc_Ntk_t *, int, Vec_Int_t *)");
    }
    Vec_IntPush(vFanins,(p_00->field_8).Fanins[1]);
  }
  return;
}

Assistant:

void Wlc_ObjCollectCopyFanins( Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    int i, iFanin;
    Wlc_Obj_t * pObj = Wlc_NtkObj( p, iObj );
    Vec_IntClear( vFanins );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Vec_IntPush( vFanins, Wlc_ObjCopy(p, iFanin) );
    // special treatment of CONST and SELECT
    if ( pObj->Type == WLC_OBJ_CONST )
    {
        int * pInts = Wlc_ObjConstValue( pObj );
        int nInts = Abc_BitWordNum( Wlc_ObjRange(pObj) );
        for ( i = 0; i < nInts; i++ )
            Vec_IntPush( vFanins, pInts[i] );
    }
    else if ( pObj->Type == WLC_OBJ_BIT_SELECT || pObj->Type == WLC_OBJ_TABLE )
    {
        assert( Vec_IntSize(vFanins) == 1 );
        Vec_IntPush( vFanins, pObj->Fanins[1] );
    }
}